

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_pkt.cc
# Opt level: O2

int bssl::dtls1_write_app_data
              (SSL *ssl,bool *out_needs_handshake,size_t *out_bytes_written,
              Span<const_unsigned_char> in)

{
  int iVar1;
  int line;
  ulong uVar2;
  uint16_t in_R9W;
  Span<const_unsigned_char> in_00;
  
  uVar2 = in.size_;
  iVar1 = SSL_in_init(ssl);
  if (iVar1 != 0) {
    __assert_fail("!SSL_in_init(ssl)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_pkt.cc"
                  ,0xef,
                  "int bssl::dtls1_write_app_data(SSL *, bool *, size_t *, Span<const uint8_t>)");
  }
  *out_needs_handshake = false;
  if (ssl->s3->write_shutdown == ssl_shutdown_none) {
    if (uVar2 < 0x4001) {
      if (uVar2 == 0) {
        *out_bytes_written = 0;
      }
      else {
        in_00.size_._0_2_ = *(undefined2 *)((long)&(ssl->d1->write_epoch).next_record.combined_ + 6)
        ;
        in_00.data_ = (uchar *)uVar2;
        in_00.size_._2_6_ = 0;
        iVar1 = dtls1_write_record((bssl *)ssl,(SSL *)0x17,(int)in.data_,in_00,in_R9W);
        if (iVar1 < 1) {
          return iVar1;
        }
        *out_bytes_written = uVar2;
      }
      return 1;
    }
    iVar1 = 0x8f;
    line = 0xf9;
  }
  else {
    iVar1 = 0xc2;
    line = 0xf3;
  }
  ERR_put_error(0x10,0,iVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_pkt.cc"
                ,line);
  return -1;
}

Assistant:

int dtls1_write_app_data(SSL *ssl, bool *out_needs_handshake,
                         size_t *out_bytes_written, Span<const uint8_t> in) {
  assert(!SSL_in_init(ssl));
  *out_needs_handshake = false;

  if (ssl->s3->write_shutdown != ssl_shutdown_none) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_PROTOCOL_IS_SHUTDOWN);
    return -1;
  }

  // DTLS does not split the input across records.
  if (in.size() > SSL3_RT_MAX_PLAIN_LENGTH) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DTLS_MESSAGE_TOO_BIG);
    return -1;
  }

  if (in.empty()) {
    *out_bytes_written = 0;
    return 1;
  }

  // TODO(crbug.com/381113363): Use the 0-RTT epoch if writing 0-RTT.
  int ret = dtls1_write_record(ssl, SSL3_RT_APPLICATION_DATA, in,
                               ssl->d1->write_epoch.epoch());
  if (ret <= 0) {
    return ret;
  }
  *out_bytes_written = in.size();
  return 1;
}